

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

rational<unsigned_long_long> * __thiscall
tcb::rational<unsigned_long_long>::operator/=
          (rational<unsigned_long_long> *this,rational<unsigned_long_long> *other)

{
  value_type_conflict7 vVar1;
  rational<unsigned_long_long> *other_local;
  rational<unsigned_long_long> *this_local;
  
  vVar1 = denom(other);
  this->num_ = vVar1 * this->num_;
  vVar1 = num(other);
  this->denom_ = vVar1 * this->denom_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator/=(const rational<U>& other)
    {
        num_ *= other.denom();
        denom_ *= other.num();
        simplify();
        return *this;
    }